

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool seq_from(Env *env,char *s,uint32_t start)

{
  char cVar1;
  ulong uVar2;
  int32_t iVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar4 = strlen(s);
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if ((sVar4 & 0xffffffff) == uVar5) {
      peek(env,(int)sVar4 + start);
      break;
    }
    cVar1 = s[uVar5];
    iVar3 = peek(env,start + (int)uVar5);
    uVar2 = uVar5 + 1;
  } while (iVar3 == cVar1);
  return (sVar4 & 0xffffffff) <= uVar5;
}

Assistant:

static bool seq_from(Env *env, const char *restrict s, uint32_t start) {
  uint32_t len = (uint32_t) strlen(s);
  for (uint32_t i = 0; i < len; i++) {
    int32_t c = s[i];
    int32_t c2 = peek(env, start + i);
    if (c != c2) return false;
  }
  peek(env, start + len);
  return true;
}